

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,XMLSize_t hostLen,int port,XMLCh *userinfo,XMLSize_t userLen)

{
  bool bVar1;
  int iVar2;
  ulong local_40;
  XMLSize_t index;
  XMLSize_t userLen_local;
  XMLCh *userinfo_local;
  int port_local;
  XMLSize_t hostLen_local;
  XMLCh *host_local;
  
  bVar1 = isWellFormedAddress(host,hostLen);
  if (bVar1) {
    if ((port < 0x10000) && ((-1 < port || (port == -1)))) {
      local_40 = 0;
      while (local_40 < userLen) {
        bVar1 = isUnreservedCharacter(userinfo[local_40]);
        if ((bVar1) ||
           (iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,userinfo[local_40]), iVar2 != -1
           )) {
          local_40 = local_40 + 1;
        }
        else {
          if (userinfo[local_40] != L'%') {
            return false;
          }
          if (((userLen <= local_40 + 2) ||
              (bVar1 = XMLString::isHex(userinfo[local_40 + 1]), !bVar1)) ||
             (bVar1 = XMLString::isHex(userinfo[local_40 + 2]), !bVar1)) {
            return false;
          }
          local_40 = local_40 + 3;
        }
      }
      host_local._7_1_ = true;
    }
    else {
      host_local._7_1_ = false;
    }
  }
  else {
    host_local._7_1_ = false;
  }
  return host_local._7_1_;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host,
                                         const XMLSize_t hostLen,
                                         const int port,
                                         const XMLCh* const userinfo,
                                         const XMLSize_t userLen)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, hostLen))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    XMLSize_t index = 0;
    while (index < userLen)
    {
        if (isUnreservedCharacter(userinfo[index]) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, userinfo[index]) != -1))
        {
            index++;
        }
        else if (userinfo[index] == chPercent)               // '%'
        {
            if (index + 2 < userLen
                && XMLString::isHex(userinfo[index+1])       // 1st hex
                && XMLString::isHex(userinfo[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}